

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O2

void __thiscall
Qentem::QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[15]>
          (QTest *this,StringStream<char16_t> *left,char16_t (*right) [15],unsigned_long line)

{
  bool bVar1;
  
  if ((this->error_ != true) || (this->continue_on_error_ == true)) {
    bVar1 = StringStream<char16_t>::operator!=(left,*right);
    if (bVar1) {
      this->error_ = true;
      PrintErrorMessage<Qentem::StringStream<char16_t>,char16_t[15]>(this,false,left,right,line);
      return;
    }
  }
  return;
}

Assistant:

QENTEM_NOINLINE void IsEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left != right)) {
            error_ = true;
            QTest::PrintErrorMessage(false, left, right, line);
        }
    }